

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_create_table.cpp
# Opt level: O2

void duckdb::CheckForeignKeyTypes
               (ColumnList *pk_columns,ColumnList *fk_columns,ForeignKeyConstraint *fk)

{
  bool bVar1;
  reference pvVar2;
  ColumnDefinition *this;
  ColumnDefinition *this_00;
  LogicalType *pLVar3;
  LogicalType *rhs;
  BinderException *this_01;
  string *psVar4;
  ulong __n;
  allocator local_e9;
  vector<duckdb::PhysicalIndex,_true> *local_e8;
  ColumnList *local_e0;
  ColumnList *local_d8;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_e8 = &(fk->info).pk_keys;
  __n = 0;
  local_e0 = pk_columns;
  local_d8 = fk_columns;
  do {
    if ((ulong)((long)(fk->info).pk_keys.
                      super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
                      super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(fk->info).pk_keys.
                      super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
                      super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= __n) {
      return;
    }
    pvVar2 = vector<duckdb::PhysicalIndex,_true>::get<true>(local_e8,__n);
    this = ColumnList::GetColumn(local_e0,(PhysicalIndex)pvVar2->index);
    pvVar2 = vector<duckdb::PhysicalIndex,_true>::get<true>(&(fk->info).fk_keys,__n);
    this_00 = ColumnList::GetColumn(local_d8,(PhysicalIndex)pvVar2->index);
    pLVar3 = ColumnDefinition::Type(this);
    rhs = ColumnDefinition::Type(this_00);
    bVar1 = LogicalType::operator!=(pLVar3,rhs);
    __n = __n + 1;
  } while (!bVar1);
  this_01 = (BinderException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_50,
             "Failed to create foreign key: incompatible types between column \"%s\" (\"%s\") and column \"%s\" (\"%s\")"
             ,&local_e9);
  psVar4 = ColumnDefinition::Name_abi_cxx11_(this);
  ::std::__cxx11::string::string((string *)&local_70,(string *)psVar4);
  pLVar3 = ColumnDefinition::Type(this);
  LogicalType::ToString_abi_cxx11_(&local_90,pLVar3);
  psVar4 = ColumnDefinition::Name_abi_cxx11_(this_00);
  ::std::__cxx11::string::string((string *)&local_b0,(string *)psVar4);
  pLVar3 = ColumnDefinition::Type(this_00);
  LogicalType::ToString_abi_cxx11_(&local_d0,pLVar3);
  BinderException::
  BinderException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (this_01,&local_50,&local_70,&local_90,&local_b0,&local_d0);
  __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void CheckForeignKeyTypes(const ColumnList &pk_columns, const ColumnList &fk_columns, ForeignKeyConstraint &fk) {
	D_ASSERT(fk.info.pk_keys.size() == fk.info.fk_keys.size());
	for (idx_t c_idx = 0; c_idx < fk.info.pk_keys.size(); c_idx++) {
		auto &pk_col = pk_columns.GetColumn(fk.info.pk_keys[c_idx]);
		auto &fk_col = fk_columns.GetColumn(fk.info.fk_keys[c_idx]);
		if (pk_col.Type() != fk_col.Type()) {
			throw BinderException("Failed to create foreign key: incompatible types between column \"%s\" (\"%s\") and "
			                      "column \"%s\" (\"%s\")",
			                      pk_col.Name(), pk_col.Type().ToString(), fk_col.Name(), fk_col.Type().ToString());
		}
	}
}